

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void __thiscall inja::Parser::add_to_template_storage(Parser *this,path *path,string *template_name)

{
  string *__lhs;
  bool bVar1;
  byte bVar2;
  int iVar3;
  mapped_type *tmpl;
  FileError *this_00;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>_>,_bool>
  pVar4;
  istreambuf_iterator<char,_std::char_traits<char>_> __beg;
  istreambuf_iterator<char,_std::char_traits<char>_> __end;
  undefined1 local_4c8 [8];
  Template include_template_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  int local_404;
  path local_400;
  _Base_ptr local_3d8;
  undefined1 local_3d0;
  string local_3c8;
  undefined1 local_3a8 [8];
  Template include_template;
  undefined1 local_328 [12];
  undefined1 local_318 [12];
  string local_308 [8];
  string text;
  ifstream file;
  _Self local_e0;
  _Self local_d8 [3];
  path local_c0;
  path local_98;
  string local_70;
  undefined1 local_50 [8];
  string original_name;
  _Self local_28;
  string *local_20;
  string *template_name_local;
  path *path_local;
  Parser *this_local;
  
  local_20 = template_name;
  template_name_local = &path->_M_pathname;
  path_local = (path *)this;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>_>_>
       ::find(this->template_storage,template_name);
  original_name.field_2._8_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>_>_>
       ::end(this->template_storage);
  bVar1 = std::operator!=(&local_28,(_Self *)((long)&original_name.field_2 + 8));
  if (bVar1) {
    return;
  }
  ::std::__cxx11::string::string((string *)local_50,(string *)local_20);
  __lhs = template_name_local;
  if ((this->config->search_included_templates_in_files & 1U) != 0) {
    ::std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_c0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
               auto_format);
    std::filesystem::__cxx11::operator/(&local_98,(path *)__lhs,&local_c0);
    std::filesystem::__cxx11::path::string(&local_70,&local_98);
    ::std::__cxx11::string::operator=((string *)local_20,(string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_70);
    std::filesystem::__cxx11::path::~path(&local_98);
    std::filesystem::__cxx11::path::~path(&local_c0);
    iVar3 = ::std::__cxx11::string::compare((ulong)local_20,0,(char *)0x2);
    if (iVar3 == 0) {
      ::std::__cxx11::string::erase((ulong)local_20,0);
    }
    local_d8[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>_>_>
         ::find(this->template_storage,local_20);
    local_e0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>_>_>
         ::end(this->template_storage);
    bVar1 = std::operator==(local_d8,&local_e0);
    if (bVar1) {
      ::std::ifstream::ifstream((void *)((long)&text.field_2 + 8));
      ::std::ifstream::open((string *)(text.field_2._M_local_buf + 8),(_Ios_Openmode)local_20);
      bVar2 = ::std::ios::fail();
      if ((bVar2 & 1) == 0) {
        std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
                  ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_318,
                   (istream_type *)(text.field_2._M_local_buf + 8));
        std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
                  ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_328);
        ::std::allocator<char>::allocator();
        __beg._12_4_ = 0;
        __beg._M_sbuf = (streambuf_type *)local_318._0_8_;
        __beg._M_c = local_318._8_4_;
        __end._12_4_ = 0;
        __end._M_sbuf = (streambuf_type *)local_328._0_8_;
        __end._M_c = local_328._8_4_;
        ::std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
                  (local_308,__beg,__end,
                   (allocator<char> *)
                   ((long)&include_template.block_storage._M_t._M_impl.super__Rb_tree_header.
                           _M_node_count + 7));
        ::std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&include_template.block_storage._M_t._M_impl.super__Rb_tree_header.
                           _M_node_count + 7));
        ::std::__cxx11::string::string((string *)&local_3c8,local_308);
        Template::Template((Template *)local_3a8,&local_3c8);
        ::std::__cxx11::string::~string((string *)&local_3c8);
        pVar4 = ::std::
                map<std::__cxx11::string,inja::Template,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,inja::Template>>>
                ::emplace<std::__cxx11::string&,inja::Template&>
                          ((map<std::__cxx11::string,inja::Template,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,inja::Template>>>
                            *)this->template_storage,local_20,(Template *)local_3a8);
        local_3d8 = (_Base_ptr)pVar4.first._M_node;
        local_3d0 = pVar4.second;
        tmpl = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>_>_>
               ::operator[](this->template_storage,local_20);
        ::std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                  (&local_400,local_20,auto_format);
        parse_into_template(this,tmpl,&local_400);
        std::filesystem::__cxx11::path::~path(&local_400);
        local_404 = 1;
        Template::~Template((Template *)local_3a8);
        ::std::__cxx11::string::~string(local_308);
      }
      else {
        bVar1 = ::std::function::operator_cast_to_bool((function *)&this->config->include_callback);
        if (!bVar1) {
          include_template_1.block_storage._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ =
               1;
          this_00 = (FileError *)__cxa_allocate_exception(0x60);
          ::std::operator+(&local_448,"failed accessing file at \'",local_20);
          ::std::operator+(&local_428,&local_448,"\'");
          FileError::FileError(this_00,&local_428);
          include_template_1.block_storage._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ =
               0;
          __cxa_throw(this_00,&FileError::typeinfo,FileError::~FileError);
        }
        local_404 = 0;
      }
      ::std::ifstream::~ifstream((void *)((long)&text.field_2 + 8));
      if (local_404 != 0) goto LAB_00161458;
    }
  }
  bVar1 = ::std::function::operator_cast_to_bool((function *)&this->config->include_callback);
  if (bVar1) {
    std::
    function<inja::Template_(const_std::filesystem::__cxx11::path_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()((Template *)local_4c8,&this->config->include_callback,(path *)template_name_local,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
    ::std::
    map<std::__cxx11::string,inja::Template,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,inja::Template>>>
    ::emplace<std::__cxx11::string&,inja::Template&>
              ((map<std::__cxx11::string,inja::Template,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,inja::Template>>>
                *)this->template_storage,local_20,(Template *)local_4c8);
    Template::~Template((Template *)local_4c8);
  }
  local_404 = 0;
LAB_00161458:
  ::std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void add_to_template_storage(const std::filesystem::path& path, std::string& template_name) {
    if (template_storage.find(template_name) != template_storage.end()) {
      return;
    }

    const std::string original_name = template_name;

    if (config.search_included_templates_in_files) {
      // Build the relative path
      template_name = (path / original_name).string();
      if (template_name.compare(0, 2, "./") == 0) {
        template_name.erase(0, 2);
      }

      if (template_storage.find(template_name) == template_storage.end()) {
        // Load file
        std::ifstream file;
        file.open(template_name);
        if (!file.fail()) {
          const std::string text((std::istreambuf_iterator<char>(file)), std::istreambuf_iterator<char>());

          auto include_template = Template(text);
          template_storage.emplace(template_name, include_template);
          parse_into_template(template_storage[template_name], template_name);
          return;
        } else if (!config.include_callback) {
          INJA_THROW(FileError("failed accessing file at '" + template_name + "'"));
        }
      }
    }

    // Try include callback
    if (config.include_callback) {
      auto include_template = config.include_callback(path, original_name);
      template_storage.emplace(template_name, include_template);
    }
  }